

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall
kratos::DebugDatabase::save_database(DebugDatabase *this,string *filename,bool override)

{
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  __node_base_ptr *this_01;
  __node_base_ptr *this_02;
  Module *this_03;
  mapped_type pMVar1;
  undefined8 *puVar2;
  bool bVar3;
  mapped_type *ppMVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  undefined7 in_register_00000011;
  Generator *top;
  Generator *extraout_RDX;
  Generator *extraout_RDX_00;
  _Rb_tree_node_base *p_Var10;
  undefined1 auVar11 [8];
  undefined8 *puVar12;
  shared_ptr<kratos::Generator> *child;
  pointer ppVar13;
  Variable local_428;
  undefined1 local_3d0 [8];
  SymbolTable table;
  undefined1 local_328 [8];
  ofstream stream;
  undefined4 uStack_31c;
  undefined1 local_128 [8];
  unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  breakpoint_conditions;
  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
  gen_mod_map;
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  visited_gens;
  _Alloc_hider local_68;
  Generator *gen_2;
  _Rb_tree_node_base *local_48;
  DebugDatabase *local_40;
  pointer local_38;
  
  top = (Generator *)CONCAT71(in_register_00000011,override);
  if (((int)top != 0) && (bVar3 = fs::exists(filename), top = extraout_RDX, bVar3)) {
    fs::remove((char *)filename);
    top = extraout_RDX_00;
  }
  compute_enable_condition_abi_cxx11_
            ((unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_128,*(kratos **)(this + 0xe8),top);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&table.reorder_,"kratos",(allocator<char> *)local_328);
  hgdb::json::SymbolTable::SymbolTable((SymbolTable *)local_3d0,(string *)&table.reorder_);
  std::__cxx11::string::~string((string *)&table.reorder_);
  breakpoint_conditions._M_h._M_single_bucket =
       (__node_base_ptr)&gen_mod_map._M_h._M_rehash_policy._M_next_resize;
  gen_mod_map._M_h._M_buckets = (__buckets_ptr)0x1;
  gen_mod_map._M_h._M_bucket_count = 0;
  gen_mod_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gen_mod_map._M_h._M_element_count._0_4_ = 0x3f800000;
  gen_mod_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  gen_mod_map._M_h._M_rehash_policy._4_4_ = 0;
  gen_mod_map._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var10 = (_Rb_tree_node_base *)(this + 0xc0);
  local_48 = p_Var10;
  local_40 = this;
  while (p_Var10 = *(_Rb_tree_node_base **)p_Var10, p_Var10 != (_Rb_tree_node_base *)0x0) {
    local_328 = (undefined1  [8])p_Var10->_M_parent;
    gen_mod_map._M_h._M_single_bucket =
         (__node_base_ptr)
         hgdb::json::SymbolTable::add_module
                   ((SymbolTable *)local_3d0,(string *)((long)local_328 + 0x78));
    std::
    _Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<kratos::Generator*&,hgdb::json::Module*&>
              ((_Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&breakpoint_conditions._M_h._M_single_bucket,local_328,
               &gen_mod_map._M_h._M_single_bucket);
  }
  this_01 = &breakpoint_conditions._M_h._M_single_bucket;
  ppVar13 = (pointer)local_48;
  while( true ) {
    p_Var10 = *(_Rb_tree_node_base **)ppVar13;
    if (p_Var10 == (_Rb_tree_node_base *)0x0) break;
    gen_mod_map._M_h._M_single_bucket = (__node_base_ptr)p_Var10->_M_parent;
    ppMVar4 = std::__detail::
              _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_01,(key_type *)&gen_mod_map._M_h._M_single_bucket);
    this_03 = *ppMVar4;
    local_38 = (pointer)p_Var10;
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)local_328,(Generator *)gen_mod_map._M_h._M_single_bucket);
    ppVar13 = (pointer)CONCAT44(uStack_31c,_stream);
    for (auVar11 = local_328; auVar11 != (undefined1  [8])ppVar13;
        auVar11 = (undefined1  [8])&(((pointer)auVar11)->first).name.field_2) {
      local_68._M_p = (((pointer)auVar11)->first).name._M_dataplus._M_p;
      iVar5 = std::
              _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_01,(key_type *)&stack0xffffffffffffff98);
      if (iVar5.
          super__Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_68._M_p = (((pointer)auVar11)->first).name._M_dataplus._M_p;
        ppMVar4 = std::__detail::
                  _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this_01,(key_type *)&stack0xffffffffffffff98);
        hgdb::json::Module::add_instance
                  (this_03,(string *)((((pointer)auVar11)->first).name._M_dataplus._M_p + 0x98),
                   *ppMVar4);
      }
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)local_328);
    ppVar13 = local_38;
  }
  this_00 = (_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(local_40 + 0x48);
  while( true ) {
    p_Var10 = *(_Rb_tree_node_base **)&local_48->_M_color;
    if (p_Var10 == (_Rb_tree_node_base *)0x0) break;
    local_68._M_p = (pointer)p_Var10->_M_parent;
    local_48 = p_Var10;
    iVar6 = std::
            _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&stack0xffffffffffffff98);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      ppMVar4 = std::__detail::
                _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&breakpoint_conditions._M_h._M_single_bucket,
                     (key_type *)&stack0xffffffffffffff98);
      pMVar1 = *ppMVar4;
      pmVar7 = std::__detail::
               _Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,(key_type *)&stack0xffffffffffffff98);
      local_38 = (pointer)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
      visited_gens._M_h._M_single_bucket = (__node_base_ptr)pMVar1;
      for (p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (pointer)p_Var8 != local_38; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        Generator::get_var((Generator *)&gen_mod_map._M_h._M_single_bucket,(string *)local_68._M_p);
        if (gen_mod_map._M_h._M_single_bucket == (__node_base_ptr)0x0) {
          add_generator_static_value
                    ((Module *)visited_gens._M_h._M_single_bucket,(string *)(p_Var8 + 1),
                     (string *)(p_Var8 + 2));
        }
        else if (((ulong)gen_mod_map._M_h._M_single_bucket[0x2d]._M_nxt & 0xfffffffb) == 0) {
          create_variables((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_328,(Var *)gen_mod_map._M_h._M_single_bucket,
                           (string *)(p_Var8 + 1));
          ppVar13 = (pointer)CONCAT44(uStack_31c,_stream);
          for (auVar11 = local_328; auVar11 != (undefined1  [8])ppVar13;
              auVar11 = (undefined1  [8])((long)auVar11 + 0x78)) {
            hgdb::json::Variable::Variable(&local_428,(Variable *)auVar11);
            std::
            vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
            ::emplace_back<hgdb::json::Variable>(&pMVar1->variables_,&local_428);
            hgdb::json::Variable::~Variable(&local_428);
          }
          std::
          vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_328);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&visited_gens);
      }
    }
  }
  gen_mod_map._M_h._M_single_bucket =
       (__node_base_ptr)&visited_gens._M_h._M_rehash_policy._M_next_resize;
  visited_gens._M_h._M_buckets = (__buckets_ptr)0x1;
  visited_gens._M_h._M_bucket_count = 0;
  visited_gens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited_gens._M_h._M_element_count._0_4_ = 0x3f800000;
  visited_gens._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited_gens._M_h._M_rehash_policy._4_4_ = 0;
  visited_gens._M_h._M_rehash_policy._M_next_resize = 0;
  puVar12 = *(undefined8 **)local_40;
  puVar2 = *(undefined8 **)(local_40 + 8);
  local_40 = local_40 + 0x18;
  this_02 = &gen_mod_map._M_h._M_single_bucket;
  local_38 = (pointer)&PTR_visit_root_002b7188;
  for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
    local_68._M_p = (pointer)Stmt::generator_parent((Stmt *)*puVar12);
    if ((((Generator *)local_68._M_p != (Generator *)0x0) &&
        (iVar9 = std::
                 _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)this_02,(key_type *)&stack0xffffffffffffff98),
        iVar9.super__Node_iterator_base<kratos::Generator_*,_false>._M_cur == (__node_type *)0x0))
       && (iVar5 = std::
                   _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&breakpoint_conditions._M_h._M_single_bucket,
                          (key_type *)&stack0xffffffffffffff98),
          iVar5.
          super__Node_iterator_base<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_false>
          ._M_cur != (__node_type *)0x0)) {
      std::
      _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<kratos::Generator*&>
                ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_02,&stack0xffffffffffffff98);
      std::__detail::
      _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)&breakpoint_conditions._M_h._M_single_bucket,(key_type *)&stack0xffffffffffffff98);
      _stream = 0;
      local_328 = (undefined1  [8])local_38;
      IRVisitor::visit_content((IRVisitor *)local_328,(Generator *)local_68._M_p);
      StmtScopeVisitor::~StmtScopeVisitor((StmtScopeVisitor *)local_328);
    }
  }
  hgdb::json::SymbolTable::compress((SymbolTable *)local_3d0);
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::ofstream::ofstream(local_328);
  std::ofstream::open((string *)local_328,(_Ios_Openmode)filename);
  hgdb::json::SymbolTable::output_abi_cxx11_
            ((string *)&stack0xffffffffffffff98,(SymbolTable *)local_3d0);
  std::operator<<((ostream *)local_328,(string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::ofstream::close();
  std::ofstream::~ofstream(local_328);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&gen_mod_map._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&breakpoint_conditions._M_h._M_single_bucket);
  hgdb::json::SymbolTable::~SymbolTable((SymbolTable *)local_3d0);
  std::
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_128);
  return;
}

Assistant:

void DebugDatabase::save_database(const std::string &filename, bool override) {
    if (override) {
        if (fs::exists(filename)) {
            fs::remove(filename);
        }
    }

    // compute breakpoint conditions
    auto breakpoint_conditions = compute_enable_condition(top_);
    auto table = hgdb::json::SymbolTable("kratos");

    std::unordered_map<Generator *, hgdb::json::Module *> gen_mod_map;

    // first pass to create modules
    for (auto *gen : generators_) {
        auto *mod = table.add_module(gen->name);
        gen_mod_map.emplace(gen, mod);
    }
    // second pass to add instances
    for (auto *gen : generators_) {
        auto *mod = gen_mod_map.at(gen);
        auto children = gen->get_child_generators();
        for (auto const &child : children) {
            if (gen_mod_map.find(child.get()) == gen_mod_map.end()) continue;
            auto *child_mod = gen_mod_map.at(child.get());
            mod->add_instance(child->instance_name, child_mod);
        }
    }

    // now add generator variables
    for (auto *gen : generators_) {
        if (variable_mapping_.find(gen) == variable_mapping_.end()) continue;
        auto *mod = gen_mod_map.at(gen);
        auto const &var_names = variable_mapping_.at(gen);
        for (auto const &[front_name, back_name] : var_names) {
            auto var = gen->get_var(back_name);
            if (var && (var->type() == VarType::Base || var->type() == VarType::PortIO)) {
                auto vars = create_variables(var.get(), front_name);
                for (auto const &v : vars) {
                    mod->add_variable(v.first);
                }
            } else if (!var) {
                add_generator_static_value(*mod, front_name, back_name);
            }
        }
    }

    // now deal with scopes
    std::unordered_set<Generator *> visited_gens;
    for (auto const *stmt : break_points_) {
        auto *gen = stmt->generator_parent();
        if (!gen || visited_gens.find(gen) != visited_gens.end()) continue;
        if (gen_mod_map.find(gen) == gen_mod_map.end()) continue;
        visited_gens.emplace(gen);
        auto *mod = gen_mod_map.at(gen);
        StmtScopeVisitor v(*mod, gen, stmt_mapping_, breakpoint_conditions);
        v.visit_content(gen);
    }

    // compress the table
    table.compress();

    // setting attributes
    table.disable_reorder();

    std::ofstream stream;
    stream.open(filename);
    stream << table.output();
    stream.close();
}